

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O0

void __thiscall SDIOAnalyzer::~SDIOAnalyzer(SDIOAnalyzer *this)

{
  SDIOAnalyzer *this_local;
  
  ~SDIOAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

SDIOAnalyzer::~SDIOAnalyzer()
{
    KillThread();
}